

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::CommittedShaderResources::Set
          (CommittedShaderResources *this,Uint32 Index,ShaderResourceBindingImplType *pSRB)

{
  undefined8 pObj;
  byte bVar1;
  bool bVar2;
  Char *Message;
  reference ppSVar3;
  reference this_00;
  reference pvVar4;
  char (*in_RCX) [32];
  uint32_t local_8c;
  ShaderResourceCacheGL *local_78;
  SRBMaskType SRBBit;
  ShaderResourceCacheImplType *pResourceCache;
  undefined1 local_40 [8];
  string msg;
  ShaderResourceBindingImplType *pSRB_local;
  Uint32 Index_local;
  CommittedShaderResources *this_local;
  
  msg.field_2._8_8_ = pSRB;
  if (7 < Index) {
    FormatString<char[26],char[32]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x466a49,
               in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Set",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x182);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (msg.field_2._8_8_ == 0) {
    local_78 = (ShaderResourceCacheGL *)0x0;
  }
  else {
    local_78 = ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::GetResourceCache
                         ((ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *)
                          msg.field_2._8_8_);
  }
  ppSVar3 = std::array<Diligent::ShaderResourceCacheGL_*,_8UL>::operator[]
                      (&this->ResourceCaches,(ulong)Index);
  *ppSVar3 = local_78;
  bVar1 = (byte)(1 << ((byte)Index & 0x1f));
  if (local_78 == (ShaderResourceCacheGL *)0x0) {
    this->StaleSRBMask = this->StaleSRBMask & (bVar1 ^ 0xff);
  }
  else {
    this->StaleSRBMask = this->StaleSRBMask | bVar1;
    bVar2 = ShaderResourceCacheGL::HasDynamicResources(local_78);
    if (bVar2) {
      this->DynamicSRBMask = this->DynamicSRBMask | bVar1;
      goto LAB_001570c1;
    }
  }
  this->DynamicSRBMask = this->DynamicSRBMask & (bVar1 ^ 0xff);
LAB_001570c1:
  pObj = msg.field_2._8_8_;
  this_00 = std::array<Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>,_8UL>::
            operator[](&this->SRBs,(ulong)Index);
  RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>::operator=
            (this_00,(ShaderResourceBindingGLImpl *)pObj);
  if (msg.field_2._8_8_ != 0) {
    this->ResourcesValidated = false;
  }
  if (local_78 == (ShaderResourceCacheGL *)0x0) {
    local_8c = 0;
  }
  else {
    local_8c = ShaderResourceCacheBase::DvpGetRevision(&local_78->super_ShaderResourceCacheBase);
  }
  pvVar4 = std::array<unsigned_int,_8UL>::operator[](&this->CacheRevisions,(ulong)Index);
  *pvVar4 = local_8c;
  return;
}

Assistant:

void Set(Uint32 Index, ShaderResourceBindingImplType* pSRB)
        {
            VERIFY_EXPR(Index < MAX_RESOURCE_SIGNATURES);
            ShaderResourceCacheImplType* pResourceCache = pSRB != nullptr ? &pSRB->GetResourceCache() : nullptr;
            ResourceCaches[Index]                       = pResourceCache;

            const SRBMaskType SRBBit = static_cast<SRBMaskType>(1u << Index);
            if (pResourceCache != nullptr)
                StaleSRBMask |= SRBBit;
            else
                StaleSRBMask &= ~SRBBit;

            if (pResourceCache != nullptr && pResourceCache->HasDynamicResources())
                DynamicSRBMask |= SRBBit;
            else
                DynamicSRBMask &= ~SRBBit;

#ifdef DILIGENT_DEVELOPMENT
            SRBs[Index] = pSRB;
            if (pSRB != nullptr)
                ResourcesValidated = false;
            CacheRevisions[Index] = pResourceCache != nullptr ? pResourceCache->DvpGetRevision() : 0;
#endif
        }